

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManAreCubeAddToTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  int iVar1;
  uint uVar2;
  Gia_ObjAre_t *pGVar3;
  Gia_StaAre_t *pSta_local;
  Gia_ObjAre_t *pObj_local;
  Gia_ManAre_t *p_local;
  
  iVar1 = Gia_StaHasValue0(pSta,*(uint *)pObj & 0x3fff);
  if (iVar1 == 0) {
    iVar1 = Gia_StaHasValue1(pSta,*(uint *)pObj & 0x3fff);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjHasBranch2(pObj);
      if (iVar1 == 0) {
        Gia_ManAreCubeAddToList(p,pObj->F + 2,pSta);
        uVar2 = (*(uint *)pObj >> 0x1a) + 1 & 0x3f;
        *(uint *)pObj = *(uint *)pObj & 0x3ffffff | uVar2 << 0x1a;
        if (uVar2 == 0x3f) {
          iVar1 = Gia_ManAreListCountListUsed(p,pObj->F[2]);
          *(uint *)pObj = *(uint *)pObj & 0x3ffffff | iVar1 << 0x1a;
          if (*(uint *)pObj >> 0x1a < 0x1f) {
            Gia_ManAreCompress(p,pObj->F + 2);
          }
          else {
            Gia_ManAreRebalance(p,pObj->F + 2);
            *(uint *)pObj = *(uint *)pObj & 0x3ffffff;
          }
        }
      }
      else {
        pGVar3 = Gia_ObjNextObj2(p,pObj);
        Gia_ManAreCubeAddToTree_rec(p,pGVar3,pSta);
      }
    }
    else {
      iVar1 = Gia_ObjHasBranch1(pObj);
      if (iVar1 == 0) {
        Gia_ManAreCubeAddToList(p,pObj->F + 1,pSta);
        uVar2 = (*(uint *)pObj >> 0x14 & 0x3f) + 1 & 0x3f;
        *(uint *)pObj = *(uint *)pObj & 0xfc0fffff | uVar2 << 0x14;
        if (uVar2 == 0x3f) {
          uVar2 = Gia_ManAreListCountListUsed(p,pObj->F[1]);
          *(uint *)pObj = *(uint *)pObj & 0xfc0fffff | (uVar2 & 0x3f) << 0x14;
          if ((*(uint *)pObj >> 0x14 & 0x3f) < 0x1f) {
            Gia_ManAreCompress(p,pObj->F + 1);
          }
          else {
            Gia_ManAreRebalance(p,pObj->F + 1);
            *(uint *)pObj = *(uint *)pObj & 0xfc0fffff;
          }
        }
      }
      else {
        pGVar3 = Gia_ObjNextObj1(p,pObj);
        Gia_ManAreCubeAddToTree_rec(p,pGVar3,pSta);
      }
    }
  }
  else {
    iVar1 = Gia_ObjHasBranch0(pObj);
    if (iVar1 == 0) {
      Gia_ManAreCubeAddToList(p,pObj->F,pSta);
      uVar2 = (*(uint *)pObj >> 0xe & 0x3f) + 1 & 0x3f;
      *(uint *)pObj = *(uint *)pObj & 0xfff03fff | uVar2 << 0xe;
      if (uVar2 == 0x3f) {
        uVar2 = Gia_ManAreListCountListUsed(p,pObj->F[0]);
        *(uint *)pObj = *(uint *)pObj & 0xfff03fff | (uVar2 & 0x3f) << 0xe;
        if ((*(uint *)pObj >> 0xe & 0x3f) < 0x1f) {
          Gia_ManAreCompress(p,pObj->F);
        }
        else {
          Gia_ManAreRebalance(p,pObj->F);
          *(uint *)pObj = *(uint *)pObj & 0xfff03fff;
        }
      }
    }
    else {
      pGVar3 = Gia_ObjNextObj0(p,pObj);
      Gia_ManAreCubeAddToTree_rec(p,pGVar3,pSta);
    }
  }
  return;
}

Assistant:

void Gia_ManAreCubeAddToTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F, pSta );
            if ( ++pObj->nStas0 == MAX_CUBE_NUM )
            {
                pObj->nStas0 = Gia_ManAreListCountListUsed( p, pObj->F[0] );
                if ( pObj->nStas0 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F );
                    pObj->nStas0 = 0;
                }
            }
        }
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F+1, pSta );
            if ( ++pObj->nStas1 == MAX_CUBE_NUM )
            {
                pObj->nStas1 = Gia_ManAreListCountListUsed( p, pObj->F[1] );
                if ( pObj->nStas1 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F+1 );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F+1 );
                    pObj->nStas1 = 0;
                }
            }
        }
    }
    else
    {
        if ( Gia_ObjHasBranch2(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F+2, pSta );
            if ( ++pObj->nStas2 == MAX_CUBE_NUM )
            {
                pObj->nStas2 = Gia_ManAreListCountListUsed( p, pObj->F[2] );
                if ( pObj->nStas2 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F+2 );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F+2 );
                    pObj->nStas2 = 0;
                }
            }
        }
    }
}